

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O0

void extend_key_56_to_64(uchar *key_56,char *key)

{
  char *key_local;
  uchar *key_56_local;
  
  *key = *key_56;
  key[1] = *key_56 << 7 | (byte)((int)(uint)key_56[1] >> 1);
  key[2] = key_56[1] << 6 | (byte)((int)(uint)key_56[2] >> 2);
  key[3] = key_56[2] << 5 | (byte)((int)(uint)key_56[3] >> 3);
  key[4] = key_56[3] << 4 | (byte)((int)(uint)key_56[4] >> 4);
  key[5] = key_56[4] << 3 | (byte)((int)(uint)key_56[5] >> 5);
  key[6] = key_56[5] << 2 | (byte)((int)(uint)key_56[6] >> 6);
  key[7] = key_56[6] << 1;
  return;
}

Assistant:

static void extend_key_56_to_64(const unsigned char *key_56, char *key)
{
  key[0] = key_56[0];
  key[1] = (unsigned char)(((key_56[0] << 7) & 0xFF) | (key_56[1] >> 1));
  key[2] = (unsigned char)(((key_56[1] << 6) & 0xFF) | (key_56[2] >> 2));
  key[3] = (unsigned char)(((key_56[2] << 5) & 0xFF) | (key_56[3] >> 3));
  key[4] = (unsigned char)(((key_56[3] << 4) & 0xFF) | (key_56[4] >> 4));
  key[5] = (unsigned char)(((key_56[4] << 3) & 0xFF) | (key_56[5] >> 5));
  key[6] = (unsigned char)(((key_56[5] << 2) & 0xFF) | (key_56[6] >> 6));
  key[7] = (unsigned char) ((key_56[6] << 1) & 0xFF);
}